

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O3

boolean figurine_location_checks(obj *obj,coord *cc,boolean quietly)

{
  char cVar1;
  byte y;
  boolean bVar2;
  obj *poVar3;
  int y_00;
  char *pcVar4;
  int x;
  
  if ((obj->where == '\x03') && ((u._1052_1_ & 1) != 0)) {
    if (quietly == '\0') {
      pcVar4 = "You don\'t have enough room in here.";
LAB_00142d18:
      pline(pcVar4);
      return '\0';
    }
  }
  else {
    cVar1 = cc->x;
    x = (int)cVar1;
    y = cc->y;
    if ((byte)(cVar1 - 1U) < 0x4f && y < 0x15) {
      y_00 = (int)(char)y;
      if ((level->locations[x][y_00].typ < '\x11') &&
         (((mons[obj->corpsenm].mflags1 & 8) == 0 ||
          (bVar2 = may_passwall(level,cVar1,y), bVar2 == '\0')))) {
        if (quietly == '\0') {
          cVar1 = level->locations[x][y_00].typ;
          pcVar4 = "a tree";
          if ((cVar1 != '\r') &&
             (((cVar1 != '\0' || ((*(uint *)&(level->flags).field_0x8 & 0x100000) == 0)) &&
              (pcVar4 = "solid rock", cVar1 == '\x0e')))) {
            pcVar4 = "a tree";
          }
          pline("You cannot place a figurine in %s!",pcVar4);
          return '\0';
        }
      }
      else {
        poVar3 = sobj_at(0x214,level,x,y_00);
        if (poVar3 == (obj *)0x0) {
          return '\x01';
        }
        if ((mons[obj->corpsenm].mflags1 & 8) != 0) {
          return '\x01';
        }
        if ((mons[obj->corpsenm].mflags2 & 0x8000000) != 0) {
          return '\x01';
        }
        if (quietly == '\0') {
          pcVar4 = "You cannot fit the figurine on the boulder.";
          goto LAB_00142d18;
        }
      }
    }
    else if (quietly == '\0') {
      pcVar4 = "You cannot put the figurine there.";
      goto LAB_00142d18;
    }
  }
  return '\0';
}

Assistant:

static boolean figurine_location_checks(struct obj *obj, coord *cc, boolean quietly)
{
	xchar x,y;

	if (carried(obj) && u.uswallow) {
		if (!quietly)
			pline("You don't have enough room in here.");
		return FALSE;
	}
	x = cc->x; y = cc->y;
	if (!isok(x,y)) {
		if (!quietly)
			pline("You cannot put the figurine there.");
		return FALSE;
	}
	if (IS_ROCK(level->locations[x][y].typ) &&
	    !(passes_walls(&mons[obj->corpsenm]) && may_passwall(level, x,y))) {
		if (!quietly)
		    pline("You cannot place a figurine in %s!",
			  IS_TREES(level, level->locations[x][y].typ) ?
			  "a tree" : "solid rock");
		return FALSE;
	}
	if (sobj_at(BOULDER, level, x,y) && !passes_walls(&mons[obj->corpsenm])
			&& !throws_rocks(&mons[obj->corpsenm])) {
		if (!quietly)
			pline("You cannot fit the figurine on the boulder.");
		return FALSE;
	}
	return TRUE;
}